

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryEffectsLoader15.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL::LibraryEffectsLoader15::begin__transparent
          (LibraryEffectsLoader15 *this,transparent__AttributeData *attributeData)

{
  byte bVar1;
  undefined4 *in_RSI;
  long in_RDI;
  transparent__AttributeData attrData;
  undefined4 local_14 [5];
  
  switch(*in_RSI) {
  case 0:
    local_14[0] = 0;
    break;
  case 1:
    local_14[0] = 1;
    break;
  case 2:
    local_14[0] = 2;
    break;
  case 3:
    local_14[0] = 3;
    break;
  case 4:
    local_14[0] = 4;
    break;
  case 5:
    local_14[0] = 5;
  }
  bVar1 = (**(code **)(**(long **)(in_RDI + 0x20) + 0x248))(*(long **)(in_RDI + 0x20),local_14);
  return (bool)(bVar1 & 1);
}

Assistant:

bool LibraryEffectsLoader15::begin__transparent( const COLLADASaxFWL15::transparent__AttributeData& attributeData )
{
SaxVirtualFunctionTest15(begin__transparent(attributeData));
COLLADASaxFWL::transparent__AttributeData attrData;
switch (attributeData.opaque) {
case COLLADASaxFWL15::ENUM__fx_opaque_enum__A_ONE: attrData.opaque=COLLADASaxFWL::ENUM__fx_opaque__A_ONE; break;
case COLLADASaxFWL15::ENUM__fx_opaque_enum__A_ZERO: attrData.opaque=COLLADASaxFWL::ENUM__fx_opaque__A_ZERO; break;
case COLLADASaxFWL15::ENUM__fx_opaque_enum__RGB_ONE: attrData.opaque=COLLADASaxFWL::ENUM__fx_opaque__RGB_ONE; break;
case COLLADASaxFWL15::ENUM__fx_opaque_enum__RGB_ZERO: attrData.opaque=COLLADASaxFWL::ENUM__fx_opaque__RGB_ZERO; break;
case COLLADASaxFWL15::ENUM__fx_opaque_enum__COUNT: attrData.opaque=COLLADASaxFWL::ENUM__fx_opaque__INVALID; break;
case COLLADASaxFWL15::ENUM__fx_opaque_enum__NOT_PRESENT: attrData.opaque=COLLADASaxFWL::ENUM__fx_opaque__NOT_PRESENT; break;
}
return mLoader->begin__transparent(attrData);
}